

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

stref idx2::GetParentPath(stref *Path)

{
  stref sVar1;
  undefined4 uStack_b0;
  undefined4 local_98;
  char local_89;
  str local_88;
  undefined8 local_80;
  str local_78;
  undefined8 local_70;
  char *local_68;
  cstr LastSlash;
  stref *Path_local;
  int local_50;
  str local_48;
  int local_40;
  long local_38;
  undefined4 local_30;
  str local_28;
  undefined4 local_20;
  undefined8 local_18;
  undefined4 local_10;
  
  local_78 = (Path->field_0).Ptr;
  local_70 = *(undefined8 *)&Path->Size;
  local_40 = (int)local_70;
  local_88 = (Path->field_0).Ptr;
  local_80 = *(undefined8 *)&Path->Size;
  local_20 = (undefined4)local_80;
  local_89 = '/';
  LastSlash = (cstr)Path;
  local_48 = local_78;
  local_28 = local_88;
  local_68 = FindLast<char*,char>(local_78 + (long)(int)local_70 + -1,local_88 + -1,&local_89);
  local_38 = *(long *)LastSlash;
  local_98 = (undefined4)*(undefined8 *)(LastSlash + 8);
  local_30 = local_98;
  if (local_68 == (char *)(local_38 + -1)) {
    Path_local = *(stref **)LastSlash;
    local_50 = (int)*(undefined8 *)(LastSlash + 8);
  }
  else {
    local_18 = *(undefined8 *)LastSlash;
    uStack_b0 = (undefined4)*(undefined8 *)(LastSlash + 8);
    local_10 = uStack_b0;
    sVar1 = SubString((stref *)LastSlash,0,(int)local_68 - (int)local_18);
    Path_local = (stref *)sVar1.field_0;
    local_50 = sVar1.Size;
  }
  sVar1.Size = local_50;
  sVar1.field_0.Ptr = (str)Path_local;
  sVar1._12_4_ = 0;
  return sVar1;
}

Assistant:

stref
GetParentPath(const stref& Path)
{
  idx2_Assert(!Contains(Path, '\\'));
  cstr LastSlash = FindLast(RevBegin(Path), RevEnd(Path), '/');
  if (LastSlash != RevEnd(Path))
    return SubString(Path, 0, int(LastSlash - Begin(Path)));

  return Path;
}